

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O3

bool __thiscall
deqp::egl::Image::GLES2ImageApi::RenderDepthbuffer::invokeGLES2
          (RenderDepthbuffer *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img,
          Texture2D *reference)

{
  ostringstream *this_00;
  ChannelOrder CVar1;
  Functions *gl;
  ConstPixelBufferAccess *this_01;
  glReadPixelsFunc p_Var2;
  bool bVar3;
  GLenum GVar4;
  GLuint GVar5;
  GLint GVar6;
  GLint GVar7;
  ObjectTraits *pOVar8;
  TestError *pTVar9;
  undefined8 *puVar10;
  int y;
  int iVar11;
  void *data;
  long lVar12;
  int iVar13;
  float fVar14;
  RGBA compareThreshold;
  Surface referenceScreen;
  Surface screen;
  Renderbuffer renderbufferDepth;
  Renderbuffer renderbufferColor;
  Framebuffer framebuffer;
  Program program;
  RGBA local_314;
  TestLog *local_310;
  Surface local_308;
  Surface local_2f0;
  Vec4 local_2d8;
  TextureFormat local_2c8;
  ObjectWrapper local_2c0;
  ObjectWrapper local_2a8;
  undefined1 local_290 [16];
  GLfloat local_280 [2];
  TextureFormat local_278;
  float fStack_270;
  GLfloat aGStack_26c [33];
  undefined1 *local_1e8;
  undefined8 uStack_1e0;
  PixelBufferAccess local_1d8;
  undefined1 local_1b0 [120];
  ios_base local_138 [32];
  GLuint local_118;
  bool local_f0;
  
  local_310 = (api->super_CallLogWrapper).m_log;
  gl = api->m_gl;
  pOVar8 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper((ObjectWrapper *)local_290,gl,pOVar8);
  pOVar8 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_2a8,gl,pOVar8);
  pOVar8 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_2c0,gl,pOVar8);
  local_314.m_value = 0x20202020;
  CVar1 = (reference->super_TextureLevelPyramid).m_format.order;
  if ((CVar1 != D) && (CVar1 != DS)) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar10 = &PTR__exception_02115f78;
    __cxa_throw(puVar10,&IllegalRendererException::typeinfo,std::exception::~exception);
  }
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = local_310;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Rendering with depth buffer",0x1b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  (*gl->bindFramebuffer)(0x8d40,(GLuint)local_280[0]);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"bindFramebuffer(GL_FRAMEBUFFER, *framebuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1d4);
  (*gl->bindRenderbuffer)(0x8d41,local_2a8.m_object);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, *renderbufferColor)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1d6);
  (*gl->renderbufferStorage)(0x8d41,0x8056,reference->m_width,reference->m_height);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,
                  "renderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, reference.getWidth(), reference.getHeight())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1d7);
  framebufferRenderbuffer(gl,0x8ce0,local_2a8.m_object);
  (*gl->bindRenderbuffer)(0x8d41,local_2c0.m_object);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, *renderbufferDepth)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1da);
  imageTargetRenderbuffer
            ((api->super_ImageApi).m_egl,gl,
             ((img->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>).
              m_data.ptr)->m_image);
  framebufferRenderbuffer(gl,0x8d00,local_2c0.m_object);
  (*gl->bindRenderbuffer)(0x8d41,0);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1dd);
  (*gl->viewport)(0,0,reference->m_width,reference->m_height);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1df);
  anon_unknown_1::Program::Program
            ((Program *)local_1b0,gl,
             "attribute highp vec2 a_coord;\nuniform highp float u_depth;\nvoid main(void) {\n\tgl_Position = vec4(a_coord, u_depth, 1.0);\n}\n"
             ,"uniform mediump vec4 u_color;\nvoid main(void) {\n\tgl_FragColor = u_color;\n}");
  if (local_f0 == false) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,(char *)0x0,"program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
               ,0x1f0);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*gl->useProgram)(local_118);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"useProgram(glProgram)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,499);
  GVar5 = (*gl->getAttribLocation)(local_118,"a_coord");
  if (GVar5 != 0xffffffff) {
    GVar6 = (*gl->getUniformLocation)(local_118,"u_color");
    if (GVar6 == -1) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Couldn\'t find uniform u_color","(int)colorLoc != (int)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                 ,0x1f9);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    GVar7 = (*gl->getUniformLocation)(local_118,"u_depth");
    if (GVar7 != -1) {
      (*gl->clearColor)(0.5,1.0,0.5,1.0);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"clearColor(0.5f, 1.0f, 0.5f, 1.0f)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x1fe);
      (*gl->clear)(0x4000);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"clear(GL_COLOR_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x1ff);
      local_278.order = 0x3f800000;
      local_278.type = SNORM_INT8;
      _fStack_270 = 0x3f80000000000000;
      aGStack_26c[1] = 0.0;
      aGStack_26c[2] = 1.0;
      aGStack_26c[3] = 0.0;
      aGStack_26c[4] = 1.0;
      aGStack_26c[5] = 1.0;
      aGStack_26c[6] = 1.0;
      aGStack_26c[7] = 0.0;
      aGStack_26c[8] = 1.0;
      aGStack_26c[9] = 0.0;
      aGStack_26c[10] = 0.0;
      aGStack_26c[0xb] = 1.0;
      aGStack_26c[0xc] = 1.0;
      aGStack_26c[0xd] = 1.0;
      aGStack_26c[0xe] = 0.0;
      aGStack_26c[0xf] = 1.0;
      aGStack_26c[0x10] = 1.0;
      aGStack_26c[0x11] = 1.0;
      aGStack_26c[0x12] = 1.0;
      aGStack_26c[0x13] = 0.0;
      aGStack_26c[0x14] = 1.0;
      aGStack_26c[0x15] = 1.0;
      aGStack_26c[0x16] = 1.0;
      aGStack_26c[0x17] = 1.0;
      aGStack_26c[0x18] = 1.0;
      aGStack_26c[0x19] = 0.5;
      aGStack_26c[0x1a] = 0.0;
      aGStack_26c[0x1b] = 0.0;
      aGStack_26c[0x1c] = 1.0;
      aGStack_26c[0x1d] = 0.0;
      aGStack_26c[0x1e] = 0.5;
      aGStack_26c[0x1f] = 0.0;
      aGStack_26c[0x20] = 1.0;
      local_1e8 = &DAT_3f0000003f000000;
      uStack_1e0 = 0x3f80000000000000;
      (*gl->enableVertexAttribArray)(GVar5);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"enableVertexAttribArray(coordLoc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x20f);
      (*gl->vertexAttribPointer)(GVar5,2,0x1406,'\0',0,squareTriangleCoords);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,
                      "vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, squareTriangleCoords)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x210);
      (*gl->enable)(0xb71);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"enable(GL_DEPTH_TEST)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x212);
      (*gl->depthFunc)(0x201);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"depthFunc(GL_LESS)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x213);
      (*gl->depthMask)('\0');
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"depthMask(GL_FALSE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x214);
      lVar12 = 0xc;
      iVar13 = 1;
      do {
        (*gl->uniform4f)(GVar6,*(GLfloat *)(local_290 + lVar12 + 0xc),
                         *(GLfloat *)((long)local_280 + lVar12),
                         *(GLfloat *)((long)local_280 + lVar12 + 4),
                         *(GLfloat *)((long)&local_278.order + lVar12));
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"uniform4f(colorLoc, color.x(), color.y(), color.z(), color.w())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x21b);
        (*gl->uniform1f)(GVar7,(float)iVar13 * 0.1 + (float)iVar13 * 0.1 + -1.0);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"uniform1f(depthLoc, clipDepth)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x21c);
        (*gl->drawArrays)(4,0,6);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"drawArrays(GL_TRIANGLES, 0, 6)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x21d);
        lVar12 = lVar12 + 0x10;
        iVar13 = iVar13 + 1;
      } while (lVar12 != 0xac);
      (*gl->depthMask)('\x01');
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"depthMask(GL_TRUE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x220);
      (*gl->disable)(0xb71);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"disable(GL_DEPTH_TEST)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x221);
      (*gl->disableVertexAttribArray)(GVar5);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"disableVertexAttribArray(coordLoc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x222);
      this_01 = &((reference->super_TextureLevelPyramid).m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
      tcu::Surface::Surface(&local_2f0,reference->m_width,reference->m_height);
      tcu::Surface::Surface(&local_308,reference->m_width,reference->m_height);
      p_Var2 = gl->readPixels;
      local_2d8.m_data[0] = 1.12104e-44;
      local_2d8.m_data[1] = 4.2039e-45;
      if ((void *)local_2f0.m_pixels.m_cap != (void *)0x0) {
        local_2f0.m_pixels.m_cap = (size_t)local_2f0.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_1d8,(TextureFormat *)&local_2d8,local_2f0.m_width,local_2f0.m_height,1,
                 (void *)local_2f0.m_pixels.m_cap);
      (*p_Var2)(0,0,local_2f0.m_width,local_2f0.m_height,0x1908,0x1401,
                local_1d8.super_ConstPixelBufferAccess.m_data);
      iVar13 = reference->m_height;
      if (0 < iVar13) {
        iVar11 = reference->m_width;
        y = 0;
        do {
          if (0 < iVar11) {
            iVar13 = 0;
            do {
              local_2d8.m_data[0] = 0.5;
              local_2d8.m_data[1] = 1.0;
              local_2d8.m_data[2] = 0.5;
              local_2d8.m_data[3] = 1.0;
              iVar11 = 1;
              lVar12 = 0;
              do {
                fVar14 = tcu::ConstPixelBufferAccess::getPixDepth(this_01,iVar13,y,0);
                if ((float)iVar11 * 0.1 < fVar14) {
                  local_2d8.m_data._0_8_ = *(TextureFormat *)((long)&local_278.order + lVar12);
                  local_2d8.m_data._8_8_ = *(undefined8 *)((long)&fStack_270 + lVar12);
                }
                lVar12 = lVar12 + 0x10;
                iVar11 = iVar11 + 1;
              } while (lVar12 != 0xa0);
              local_2c8.order = RGBA;
              local_2c8.type = UNORM_INT8;
              data = (void *)local_308.m_pixels.m_cap;
              if ((void *)local_308.m_pixels.m_cap != (void *)0x0) {
                data = local_308.m_pixels.m_ptr;
              }
              tcu::PixelBufferAccess::PixelBufferAccess
                        (&local_1d8,&local_2c8,local_308.m_width,local_308.m_height,1,data);
              tcu::PixelBufferAccess::setPixel(&local_1d8,&local_2d8,iVar13,y,0);
              iVar13 = iVar13 + 1;
              iVar11 = reference->m_width;
            } while (iVar13 < iVar11);
            iVar13 = reference->m_height;
          }
          y = y + 1;
        } while (y < iVar13);
      }
      (*gl->bindFramebuffer)(0x8d40,0);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"bindFramebuffer(GL_FRAMEBUFFER, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x23a);
      (*gl->finish)();
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"finish()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x23b);
      bVar3 = tcu::pixelThresholdCompare
                        (local_310,"Depth buffer rendering result",
                         "Result from rendering with depth buffer",&local_308,&local_2f0,&local_314,
                         COMPARE_LOG_RESULT);
      tcu::Surface::~Surface(&local_308);
      tcu::Surface::~Surface(&local_2f0);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1b0);
      glu::ObjectWrapper::~ObjectWrapper(&local_2c0);
      glu::ObjectWrapper::~ObjectWrapper(&local_2a8);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_290);
      return bVar3;
    }
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Couldn\'t find uniform u_depth","(int)depthLoc != (int)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
               ,0x1fc);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,"Couldn\'t find attribute a_coord","(int)coordLoc != -1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
             ,0x1f6);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool GLES2ImageApi::RenderDepthbuffer::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& img, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl					= api.m_gl;
	tcu::TestLog&			log					= api.getLog();
	Framebuffer				framebuffer			(gl);
	Renderbuffer			renderbufferColor	(gl);
	Renderbuffer			renderbufferDepth	(gl);
	const tcu::RGBA			compareThreshold	(32, 32, 32, 32); // layer colors are far apart, large thresholds are ok

	// Branch only taken in TryAll case
	if (reference.getFormat().order != tcu::TextureFormat::DS && reference.getFormat().order != tcu::TextureFormat::D)
		throw IllegalRendererException(); // Skip, interpreting non-depth data as depth data is not meaningful

	log << tcu::TestLog::Message << "Rendering with depth buffer" << tcu::TestLog::EndMessage;

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, *framebuffer));

	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, *renderbufferColor));
	GLU_CHECK_GLW_CALL(gl, renderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, reference.getWidth(), reference.getHeight()));
	framebufferRenderbuffer(gl, GL_COLOR_ATTACHMENT0, *renderbufferColor);

	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, *renderbufferDepth));
	imageTargetRenderbuffer(api.m_egl, gl, **img);
	framebufferRenderbuffer(gl, GL_DEPTH_ATTACHMENT, *renderbufferDepth);
	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, 0));

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));

	// Render
	const char* vertexShader =
		"attribute highp vec2 a_coord;\n"
		"uniform highp float u_depth;\n"
		"void main(void) {\n"
		"\tgl_Position = vec4(a_coord, u_depth, 1.0);\n"
		"}\n";

	const char* fragmentShader =
		"uniform mediump vec4 u_color;\n"
		"void main(void) {\n"
		"\tgl_FragColor = u_color;\n"
		"}";

	Program program(gl, vertexShader, fragmentShader);
	TCU_CHECK(program.isOk());

	GLuint glProgram = program.getProgram();
	GLU_CHECK_GLW_CALL(gl, useProgram(glProgram));

	GLuint coordLoc = gl.getAttribLocation(glProgram, "a_coord");
	TCU_CHECK_MSG((int)coordLoc != -1, "Couldn't find attribute a_coord");

	GLuint colorLoc = gl.getUniformLocation(glProgram, "u_color");
	TCU_CHECK_MSG((int)colorLoc != (int)-1, "Couldn't find uniform u_color");

	GLuint depthLoc = gl.getUniformLocation(glProgram, "u_depth");
	TCU_CHECK_MSG((int)depthLoc != (int)-1, "Couldn't find uniform u_depth");

	GLU_CHECK_GLW_CALL(gl, clearColor(0.5f, 1.0f, 0.5f, 1.0f));
	GLU_CHECK_GLW_CALL(gl, clear(GL_COLOR_BUFFER_BIT));

	tcu::Vec4 depthLevelColors[] = {
		tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f),

		tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
		tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f),
		tcu::Vec4(0.5f, 0.5f, 0.0f, 1.0f)
	};

	GLU_CHECK_GLW_CALL(gl, enableVertexAttribArray(coordLoc));
	GLU_CHECK_GLW_CALL(gl, vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, squareTriangleCoords));

	GLU_CHECK_GLW_CALL(gl, enable(GL_DEPTH_TEST));
	GLU_CHECK_GLW_CALL(gl, depthFunc(GL_LESS));
	GLU_CHECK_GLW_CALL(gl, depthMask(GL_FALSE));

	for (int level = 0; level < DE_LENGTH_OF_ARRAY(depthLevelColors); level++)
	{
		const tcu::Vec4	color		= depthLevelColors[level];
		const float		clipDepth	= ((float)(level + 1) * 0.1f) * 2.0f - 1.0f; // depth in clip coords

		GLU_CHECK_GLW_CALL(gl, uniform4f(colorLoc, color.x(), color.y(), color.z(), color.w()));
		GLU_CHECK_GLW_CALL(gl, uniform1f(depthLoc, clipDepth));
		GLU_CHECK_GLW_CALL(gl, drawArrays(GL_TRIANGLES, 0, 6));
	}

	GLU_CHECK_GLW_CALL(gl, depthMask(GL_TRUE));
	GLU_CHECK_GLW_CALL(gl, disable(GL_DEPTH_TEST));
	GLU_CHECK_GLW_CALL(gl, disableVertexAttribArray(coordLoc));

	const ConstPixelBufferAccess&	refAccess		= reference.getLevel(0);
	tcu::Surface					screen			(reference.getWidth(), reference.getHeight());
	tcu::Surface					referenceScreen	(reference.getWidth(), reference.getHeight());

	gl.readPixels(0, 0, screen.getWidth(), screen.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen.getAccess().getDataPtr());

	for (int y = 0; y < reference.getHeight(); y++)
	{
		for (int x = 0; x < reference.getWidth(); x++)
		{
			tcu::Vec4 result = tcu::Vec4(0.5f, 1.0f, 0.5f, 1.0f);

			for (int level = 0; level < DE_LENGTH_OF_ARRAY(depthLevelColors); level++)
			{
				if ((float)(level + 1) * 0.1f < refAccess.getPixDepth(x, y))
					result = depthLevelColors[level];
			}

			referenceScreen.getAccess().setPixel(result, x, y);
		}
	}

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, 0));
	GLU_CHECK_GLW_CALL(gl, finish());

	return tcu::pixelThresholdCompare(log, "Depth buffer rendering result", "Result from rendering with depth buffer", referenceScreen, screen, compareThreshold, tcu::COMPARE_LOG_RESULT);
}